

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address_no_zone.c
# Opt level: O1

void * lyplg_type_print_ipv6_address_no_zone
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__cp;
  LY_ERR LVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  
  __cp = &value->field_2;
  if (format == LY_VALUE_LYB) {
    *dynamic = '\0';
    if (value_len == (size_t *)0x0) {
      return __cp;
    }
    *value_len = 0x10;
    return __cp;
  }
  if (value->_canonical == (char *)0x0) {
    pcVar3 = (char *)malloc(0x2e);
    if (pcVar3 == (char *)0x0) {
      return (void *)0x0;
    }
    pcVar4 = inet_ntop(10,__cp,pcVar3,0x2e);
    if (pcVar4 == (char *)0x0) {
      free(pcVar3);
      piVar5 = __errno_location();
      pcVar3 = strerror(*piVar5);
      pcVar4 = "Failed to get IPv6 address in string (%s).";
      LVar1 = LY_ESYS;
    }
    else {
      LVar1 = lydict_insert_zc(ctx,pcVar3,&value->_canonical);
      if (LVar1 == LY_SUCCESS) goto LAB_001c2ff3;
      pcVar4 = "Memory allocation failed (%s()).";
      pcVar3 = "lyplg_type_print_ipv6_address_no_zone";
      LVar1 = LY_EMEM;
    }
    pcVar6 = (char *)0x0;
    ly_log(ctx,LY_LLERR,LVar1,pcVar4,pcVar3);
  }
  else {
LAB_001c2ff3:
    if (dynamic != (ly_bool *)0x0) {
      *dynamic = '\0';
    }
    if (value_len != (size_t *)0x0) {
      sVar2 = strlen(value->_canonical);
      *value_len = sVar2;
    }
    pcVar6 = value->_canonical;
  }
  return pcVar6;
}

Assistant:

static const void *
lyplg_type_print_ipv6_address_no_zone(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lyd_value_ipv6_address_no_zone *val;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        *dynamic = 0;
        if (value_len) {
            *value_len = sizeof val->addr;
        }
        return &val->addr;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* '%' + zone */
        ret = malloc(INET6_ADDRSTRLEN);
        LY_CHECK_RET(!ret, NULL);

        /* get the address in string */
        if (!inet_ntop(AF_INET6, &val->addr, ret, INET6_ADDRSTRLEN)) {
            free(ret);
            LOGERR(ctx, LY_ESYS, "Failed to get IPv6 address in string (%s).", strerror(errno));
            return NULL;
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}